

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O3

bool __thiscall
ON_OffsetSurfaceFunction::SetSideTangency(ON_OffsetSurfaceFunction *this,int side,bool bEnable)

{
  if ((uint)side < 4) {
    this->m_bZeroSideDerivative[(uint)side] = bEnable;
    this->m_bValid = false;
  }
  return (uint)side < 4;
}

Assistant:

bool ON_OffsetSurfaceFunction::SetSideTangency(
  int side,
  bool bEnable
  )
{
  bool rc = false;
  if ( 0 <= side && side < 4 )
  {
    m_bZeroSideDerivative[side] = bEnable?true:false;
    m_bValid = false;
    rc = true;
  }
  return rc;
}